

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<PLSArg,_8UL>::push_back(SmallVector<PLSArg,_8UL> *this,PLSArg *t)

{
  PLSArg *t_local;
  SmallVector<PLSArg,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<PLSArg>).buffer_size + 1);
  PLSArg::PLSArg((this->super_VectorView<PLSArg>).ptr + (this->super_VectorView<PLSArg>).buffer_size
                 ,t);
  (this->super_VectorView<PLSArg>).buffer_size = (this->super_VectorView<PLSArg>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}